

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O3

void __thiscall fizplex::Base::btran(Base *this,DVector *vec)

{
  double dVar1;
  double *pdVar2;
  pointer pEVar3;
  pointer pNVar4;
  long lVar5;
  size_t sVar6;
  DVector w;
  double local_58;
  DVector local_50;
  double local_38;
  
  DVector::DVector(&local_50,this->m);
  if (this->m != 0) {
    sVar6 = 0;
    do {
      pdVar2 = DVector::operator[](vec,(this->row_ordering)._M_t.
                                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                       [sVar6]);
      dVar1 = *pdVar2;
      pdVar2 = DVector::operator[](&local_50,sVar6);
      *pdVar2 = dVar1;
      sVar6 = sVar6 + 1;
    } while (sVar6 < this->m);
  }
  lVar5 = (long)(this->etms).
                super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->etms).
                super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 5;
    do {
      lVar5 = lVar5 + -1;
      pEVar3 = (this->etms).
               super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
               super__Vector_impl_data._M_start;
      pNVar4 = *(pointer *)&pEVar3[lVar5].eta.values;
      if (pNVar4 == *(pointer *)((long)&pEVar3[lVar5].eta.values + 8)) {
        local_58 = 0.0;
      }
      else {
        local_58 = 0.0;
        do {
          local_38 = pNVar4->value;
          pdVar2 = DVector::operator[](&local_50,pNVar4->index);
          local_58 = local_58 + local_38 * *pdVar2;
          pNVar4 = pNVar4 + 1;
          pEVar3 = (this->etms).
                   super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (pNVar4 != *(pointer *)((long)&pEVar3[lVar5].eta.values + 8));
      }
      pdVar2 = DVector::operator[](&local_50,pEVar3[lVar5].col);
      *pdVar2 = local_58;
    } while (lVar5 != 0);
  }
  sVar6 = (vec->vals)._M_size;
  if (sVar6 == local_50.vals._M_size) {
    if (sVar6 == 0) goto LAB_00111945;
    pdVar2 = (vec->vals)._M_data;
  }
  else {
    pdVar2 = (vec->vals)._M_data;
    if (pdVar2 != (double *)0x0) {
      operator_delete(pdVar2);
    }
    (vec->vals)._M_size = local_50.vals._M_size;
    pdVar2 = (double *)operator_new(local_50.vals._M_size << 3);
    (vec->vals)._M_data = pdVar2;
    if (local_50.vals._M_data == (double *)0x0) goto LAB_00111945;
    sVar6 = (vec->vals)._M_size;
  }
  memcpy(pdVar2,local_50.vals._M_data,sVar6 << 3);
LAB_00111945:
  vec->dim = local_50.dim;
  operator_delete(local_50.vals._M_data);
  return;
}

Assistant:

void Base::btran(DVector &vec) const {
  DVector w(m);
  for (size_t i = 0; i < m; i++)
    w[i] = vec[row_ordering[i]];

  for (size_t i = etms.size(); i-- > 0;) {
    double d = 0.0;
    for (auto it = etms[i].eta.cbegin(); it != etms[i].eta.cend(); ++it)
      d += it->value * w[it->index];
    w[etms[i].col] = d;
  }

  vec = w;
}